

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O2

void __thiscall
trng::correlated_normal_dist<double>::param_type::Cholesky_factorization(param_type *this)

{
  double dVar1;
  pointer pdVar2;
  pointer pdVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  
  uVar4 = this->d_;
  lVar8 = 0;
  uVar9 = 0;
  while (uVar9 < uVar4) {
    pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = 0;
    for (uVar6 = 0;
        pdVar3 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar6 != uVar9; uVar6 = uVar6 + 1) {
      dVar10 = 0.0;
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        dVar10 = dVar10 + *(double *)((long)pdVar3 + uVar7 * 8 + uVar4 * lVar8) *
                          *(double *)((long)pdVar3 + uVar7 * 8 + lVar5);
      }
      pdVar2[uVar4 * uVar9 + uVar6] =
           (pdVar2[uVar4 * uVar9 + uVar6] - dVar10) / pdVar2[uVar6 * (uVar4 + 1)];
      lVar5 = lVar5 + uVar4 * 8;
    }
    dVar10 = 0.0;
    for (uVar6 = 0; uVar9 != uVar6; uVar6 = uVar6 + 1) {
      dVar1 = *(double *)((long)pdVar3 + uVar6 * 8 + uVar4 * lVar8);
      dVar10 = dVar10 + dVar1 * dVar1;
    }
    dVar10 = pdVar3[(uVar4 + 1) * uVar9] - dVar10;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    pdVar2 = (this->H_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = this->d_;
    pdVar2[(uVar4 + 1) * uVar9] = dVar10;
    uVar9 = uVar9 + 1;
    for (uVar6 = uVar9; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      *(undefined8 *)((long)pdVar2 + uVar6 * 8 + uVar4 * lVar8) = 0;
    }
    lVar8 = lVar8 + 8;
  }
  return;
}

Assistant:

void Cholesky_factorization() {
        for (size_type i{0}; i < d_; ++i) {
          for (size_type k{0}; k < i; ++k) {
            result_type t{0};
            for (size_type j{0}; j < k; ++j)
              t += H_[i * d_ + j] * H_[k * d_ + j];
            H_[i * d_ + k] = (H_[i * d_ + k] - t) / H_[k * d_ + k];
          }
          result_type t{0};
          for (size_type j{0}; j < i; ++j)
            t += H_[i * d_ + j] * H_[i * d_ + j];
          H_[i * d_ + i] = trng::math::sqrt(H_[i * d_ + i] - t);
          for (size_type k{i + 1}; k < d_; ++k)
            H_[i * d_ + k] = 0;
        }
      }